

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::ElementInstance::ParseInstance
               (char **pCur,Element *pcElement,ElementInstance *p_pcOut)

{
  bool bVar1;
  size_type __new_size;
  reference pPVar2;
  reference pPVar3;
  Logger *this;
  ValueUnion local_40;
  ValueUnion v;
  __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
  local_30;
  const_iterator a;
  iterator i;
  ElementInstance *p_pcOut_local;
  Element *pcElement_local;
  char **pCur_local;
  
  if (pcElement == (Element *)0x0) {
    __assert_fail("__null != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x30a,
                  "static bool Assimp::PLY::ElementInstance::ParseInstance(const char *&, const PLY::Element *, PLY::ElementInstance *)"
                 );
  }
  if (p_pcOut != (ElementInstance *)0x0) {
    __new_size = std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::size
                           (&pcElement->alProperties);
    std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>::
    resize(&p_pcOut->alProperties,__new_size);
    a._M_current = (Property *)
                   std::
                   vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                   ::begin(&p_pcOut->alProperties);
    local_30._M_current =
         (Property *)
         std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::begin
                   (&pcElement->alProperties);
    while( true ) {
      v = (ValueUnion)
          std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ::end(&p_pcOut->alProperties);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
                          *)&a,(__normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
                                *)&v);
      if (!bVar1) break;
      pPVar2 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
               ::operator*(&local_30);
      pPVar3 = __gnu_cxx::
               __normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
               ::operator*((__normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
                            *)&a);
      bVar1 = PropertyInstance::ParseInstance(pCur,pPVar2,pPVar3);
      if (!bVar1) {
        this = DefaultLogger::get();
        Logger::warn(this,"Unable to parse property instance. Skipping this element instance");
        pPVar2 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                 ::operator*(&local_30);
        local_40 = PropertyInstance::DefaultValue(pPVar2->eType);
        pPVar3 = __gnu_cxx::
                 __normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
                 ::operator*((__normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
                              *)&a);
        std::
        vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ::push_back(&pPVar3->avList,&local_40);
      }
      __gnu_cxx::
      __normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
      ::operator++((__normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
                    *)&a);
      __gnu_cxx::
      __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
      ::operator++(&local_30);
    }
    return true;
  }
  __assert_fail("__null != p_pcOut",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                ,0x30b,
                "static bool Assimp::PLY::ElementInstance::ParseInstance(const char *&, const PLY::Element *, PLY::ElementInstance *)"
               );
}

Assistant:

bool PLY::ElementInstance::ParseInstance(const char* &pCur,
  const PLY::Element* pcElement,
  PLY::ElementInstance* p_pcOut)
{
  ai_assert(NULL != pcElement);
  ai_assert(NULL != p_pcOut);

  // allocate enough storage
  p_pcOut->alProperties.resize(pcElement->alProperties.size());

  std::vector<PLY::PropertyInstance>::iterator i = p_pcOut->alProperties.begin();
  std::vector<PLY::Property>::const_iterator  a = pcElement->alProperties.begin();
  for (; i != p_pcOut->alProperties.end(); ++i, ++a)
  {
    if (!(PLY::PropertyInstance::ParseInstance(pCur, &(*a), &(*i))))
    {
        ASSIMP_LOG_WARN("Unable to parse property instance. "
        "Skipping this element instance");

      PLY::PropertyInstance::ValueUnion v = PLY::PropertyInstance::DefaultValue((*a).eType);
      (*i).avList.push_back(v);
    }
  }
  return true;
}